

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# makelevelset3.cpp
# Opt level: O3

float point_triangle_distance(Vec3f *x0,Vec3f *x1,Vec3f *x2,Vec3f *x3)

{
  float fVar1;
  uint i;
  long lVar2;
  Vec3f *x2_00;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  float fVar10;
  undefined1 auVar11 [64];
  float fVar12;
  float fVar14;
  undefined1 auVar13 [16];
  float fVar15;
  float fVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  Vec<3U,_float> w;
  undefined1 local_50 [8];
  float fStack_48;
  float fStack_44;
  undefined8 local_40;
  float fStack_38;
  undefined8 local_30;
  float fStack_28;
  undefined1 extraout_var [60];
  
  fVar1 = fStack_44;
  fStack_48 = x1->v[2];
  local_50 = (undefined1  [8])*(undefined8 *)x1->v;
  auVar3._0_12_ = SUB1612(*(undefined1 (*) [16])x3,0);
  auVar3._12_4_ = 0;
  auVar4._0_12_ = local_50._0_12_;
  auVar4._12_4_ = 0;
  auVar4 = vsubps_avx(auVar4,auVar3);
  fStack_48 = auVar4._8_4_;
  fVar10 = fStack_48;
  local_50 = auVar4._0_8_;
  auVar13._8_8_ = 0;
  auVar13._0_8_ = local_50;
  fStack_48 = x2->v[2];
  _local_50 = CONCAT412(fVar1,_local_50);
  auVar3 = vmovshdup_avx(auVar13);
  local_50 = (undefined1  [8])*(undefined8 *)x2->v;
  auVar5._0_12_ = SUB1612(*(undefined1 (*) [16])x3,0);
  auVar5._12_4_ = 0;
  auVar6._0_12_ = local_50._0_12_;
  auVar6._12_4_ = 0;
  auVar5 = vsubps_avx(auVar6,auVar5);
  fStack_48 = auVar5._8_4_;
  fVar12 = fStack_48;
  local_50 = auVar5._0_8_;
  auVar17._8_8_ = 0;
  auVar17._0_8_ = local_50;
  fStack_48 = x0->v[2];
  _local_50 = CONCAT412(fVar1,_local_50);
  fVar14 = auVar4._0_4_;
  fVar15 = auVar5._0_4_;
  auVar4 = vmovshdup_avx(auVar17);
  local_50 = (undefined1  [8])*(undefined8 *)x0->v;
  auVar5 = vfmadd231ss_fma(ZEXT416((uint)(fVar14 * fVar15)),auVar3,auVar4);
  auVar7._0_12_ = SUB1612(*(undefined1 (*) [16])x3,0);
  auVar7._12_4_ = 0;
  auVar8._0_12_ = local_50._0_12_;
  auVar8._12_4_ = 0;
  auVar13 = vfmadd231ss_fma(auVar5,ZEXT416((uint)fVar10),ZEXT416((uint)fVar12));
  auVar6 = vsubps_avx(auVar8,auVar7);
  auVar9._0_12_ = auVar6._0_12_;
  auVar9._12_4_ = fVar1;
  local_50 = auVar6._0_8_;
  auVar18._8_8_ = 0;
  auVar18._0_8_ = local_50;
  fStack_48 = auVar6._8_4_;
  auVar5 = vmovshdup_avx(auVar18);
  fVar16 = auVar13._0_4_;
  auVar13 = vfmadd231ss_fma(ZEXT416((uint)(fVar15 * auVar6._0_4_)),auVar4,auVar5);
  auVar5 = vfmadd231ss_fma(ZEXT416((uint)(fVar14 * auVar6._0_4_)),auVar5,auVar3);
  auVar7 = ZEXT416((uint)(fVar10 * fVar10 + auVar3._0_4_ * auVar3._0_4_ + fVar14 * fVar14));
  auVar6 = ZEXT416((uint)(fVar12 * fVar12 + auVar4._0_4_ * auVar4._0_4_ + fVar15 * fVar15));
  auVar3 = vfmsub231ss_fma(ZEXT416((uint)(fVar16 * fVar16)),auVar7,auVar6);
  auVar4 = vfmadd231ss_fma(auVar13,ZEXT416((uint)fVar12),ZEXT416((uint)fStack_48));
  auVar5 = vfmadd231ss_fma(auVar5,ZEXT416((uint)fStack_48),ZEXT416((uint)fVar10));
  auVar3 = vmaxss_avx(SUB6416(ZEXT464(0xda24260),0),auVar3);
  auVar6 = vfmsub231ss_fma(ZEXT416((uint)(fVar16 * auVar4._0_4_)),auVar5,auVar6);
  auVar4 = vfmsub231ss_fma(ZEXT416((uint)(fVar16 * auVar5._0_4_)),auVar7,auVar4);
  fStack_28 = 1.0 / auVar3._0_4_;
  fVar10 = fStack_28 * auVar6._0_4_;
  fStack_28 = fStack_28 * auVar4._0_4_;
  if (((fVar10 < 0.0) || (fStack_28 < 0.0)) ||
     (fStack_38 = (1.0 - fVar10) - fStack_28, fStack_38 < 0.0)) {
    _local_50 = auVar9;
    if (fVar10 <= 0.0) {
      x2_00 = x3;
      if (0.0 < fStack_28) {
        x2_00 = x2;
      }
      fVar10 = point_segment_distance(x0,x1,x2_00);
      x1 = x2;
      fStack_44 = fVar10;
    }
    else {
      fVar10 = point_segment_distance(x0,x1,x2);
      fStack_44 = fVar10;
    }
    auVar11._0_4_ = point_segment_distance(x0,x1,x3);
    auVar11._4_60_ = extraout_var;
    auVar3 = vminss_avx(auVar11._0_16_,ZEXT416((uint)fStack_44));
    fVar10 = auVar3._0_4_;
  }
  else {
    local_50._0_4_ = (undefined4)*(undefined8 *)x1->v;
    local_50._4_4_ = (undefined4)((ulong)*(undefined8 *)x1->v >> 0x20);
    fVar15 = fVar10 * (float)local_50._0_4_;
    fVar16 = fVar10 * (float)local_50._4_4_;
    local_50._0_4_ = (undefined4)*(undefined8 *)x2->v;
    local_50._4_4_ = (undefined4)((ulong)*(undefined8 *)x2->v >> 0x20);
    fVar12 = fStack_28 * (float)local_50._0_4_;
    fVar14 = fStack_28 * (float)local_50._4_4_;
    fStack_28 = fStack_28 * x2->v[2];
    local_50._4_4_ = fVar14;
    local_50._0_4_ = fVar12;
    local_30 = local_50;
    lVar2 = 1;
    local_50._0_4_ = (undefined4)*(undefined8 *)x3->v;
    local_50._4_4_ = (undefined4)((ulong)*(undefined8 *)x3->v >> 0x20);
    local_50._0_4_ = fStack_38 * (float)local_50._0_4_;
    local_50._4_4_ = fStack_38 * (float)local_50._4_4_;
    fStack_38 = fStack_38 * x3->v[2];
    local_40 = local_50;
    local_50._0_4_ = (float)local_50._0_4_ + fVar12 + fVar15;
    local_50._4_4_ = (float)local_50._4_4_ + fVar14 + fVar16;
    fStack_48 = fStack_38 + fStack_28 + fVar10 * x1->v[2];
    _local_50 = CONCAT412(fVar1,_local_50);
    fVar10 = x0->v[0] - (float)local_50._0_4_;
    fVar10 = fVar10 * fVar10;
    do {
      fVar12 = x0->v[lVar2] - *(float *)(local_50 + lVar2 * 4);
      lVar2 = lVar2 + 1;
      fVar10 = fVar10 + fVar12 * fVar12;
    } while (lVar2 != 3);
    if (fVar10 < 0.0) {
      fVar10 = sqrtf(fVar10);
    }
    else {
      auVar3 = vsqrtss_avx(ZEXT416((uint)fVar10),ZEXT416((uint)fVar10));
      fVar10 = auVar3._0_4_;
    }
  }
  return fVar10;
}

Assistant:

static float point_triangle_distance(const Vec3f &x0, const Vec3f &x1, const Vec3f &x2,
                                     const Vec3f &x3) {
  // first find barycentric coordinates of closest point on infinite plane
  Vec3f x13(x1 - x3), x23(x2 - x3), x03(x0 - x3);
  float m13 = mag2(x13), m23 = mag2(x23), d = dot(x13, x23);
  float invdet = 1.f / max(m13 * m23 - d * d, 1e-30f);
  float a = dot(x13, x03), b = dot(x23, x03);
  // the barycentric coordinates themselves
  float w23 = invdet * (m23 * a - d * b);
  float w31 = invdet * (m13 * b - d * a);
  float w12 = 1 - w23 - w31;
  if (w23 >= 0 && w31 >= 0 && w12 >= 0) {  // if we're inside the triangle
    return dist(x0, w23 * x1 + w31 * x2 + w12 * x3);
  } else {        // we have to clamp to one of the edges
    if (w23 > 0)  // this rules out edge 2-3 for us
      return min(point_segment_distance(x0, x1, x2), point_segment_distance(x0, x1, x3));
    else if (w31 > 0)  // this rules out edge 1-3
      return min(point_segment_distance(x0, x1, x2), point_segment_distance(x0, x2, x3));
    else  // w12 must be >0, ruling out edge 1-2
      return min(point_segment_distance(x0, x1, x3), point_segment_distance(x0, x2, x3));
  }
}